

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O0

TRef lj_opt_narrow_convert(jit_State *J)

{
  int iVar1;
  IRRef IVar2;
  undefined1 local_438 [8];
  NarrowConv nc;
  jit_State *J_local;
  
  if ((J->flags & 0x200000) != 0) {
    nc.J = (jit_State *)&nc.mode;
    nc.sp = nc.stack + 0xfa;
    nc.maxsp._4_4_ = (J->fold).ins.field_1.t.irt & 0x1f;
    if ((J->fold).ins.field_1.o == '\\') {
      nc.maxsp._0_4_ = 0;
    }
    else {
      nc.maxsp._0_4_ = (uint)(J->fold).ins.field_0.op2;
    }
    local_438 = (undefined1  [8])J;
    nc.stack._1016_8_ = J;
    iVar1 = narrow_conv_backprop((NarrowConv *)local_438,(uint)(J->fold).ins.field_0.op1,0);
    if (iVar1 < 2) {
      IVar2 = narrow_conv_emit((jit_State *)nc.stack._1016_8_,(NarrowConv *)local_438);
      return IVar2;
    }
  }
  return 0;
}

Assistant:

TRef LJ_FASTCALL lj_opt_narrow_convert(jit_State *J)
{
  if ((J->flags & JIT_F_OPT_NARROW)) {
    NarrowConv nc;
    nc.J = J;
    nc.sp = nc.stack;
    nc.maxsp = &nc.stack[NARROW_MAX_STACK-4];
    nc.t = irt_type(fins->t);
    if (fins->o == IR_TOBIT) {
      nc.mode = IRCONV_TOBIT;  /* Used only in the backpropagation cache. */
    } else {
      nc.mode = fins->op2;
    }
    if (narrow_conv_backprop(&nc, fins->op1, 0) <= 1)
      return narrow_conv_emit(J, &nc);
  }
  return NEXTFOLD;
}